

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

void al_get_separate_blender(int *op,int *src,int *dst,int *alpha_op,int *alpha_src,int *alpha_dst)

{
  long lVar1;
  long *plVar2;
  
  plVar2 = (long *)__tls_get_addr(&PTR_001d9500);
  if (*plVar2 == 0) {
    *plVar2 = (long)(plVar2 + 1);
    initialize_tls_values((thread_local_state *)(plVar2 + 1));
  }
  lVar1 = *plVar2;
  if (lVar1 != 0) {
    if (op != (int *)0x0) {
      *op = *(int *)(lVar1 + 0xe0);
    }
    if (src != (int *)0x0) {
      *src = *(int *)(lVar1 + 0xe4);
    }
    if (dst != (int *)0x0) {
      *dst = *(int *)(lVar1 + 0xe8);
    }
    if (alpha_op != (int *)0x0) {
      *alpha_op = *(int *)(lVar1 + 0xec);
    }
    if (alpha_src != (int *)0x0) {
      *alpha_src = *(int *)(lVar1 + 0xf0);
    }
    if (alpha_dst != (int *)0x0) {
      *alpha_dst = *(int *)(lVar1 + 0xf4);
    }
  }
  return;
}

Assistant:

void al_get_separate_blender(int *op, int *src, int *dst,
   int *alpha_op, int *alpha_src, int *alpha_dst)
{
   thread_local_state *tls;
   ALLEGRO_BLENDER *b;

   if ((tls = tls_get()) == NULL)
      return;

   b = &tls->current_blender;

   if (op)
      *op = b->blend_op;

   if (src)
      *src = b->blend_source;

   if (dst)
      *dst = b->blend_dest;

   if (alpha_op)
      *alpha_op = b->blend_alpha_op;

   if (alpha_src)
      *alpha_src = b->blend_alpha_source;

   if (alpha_dst)
      *alpha_dst = b->blend_alpha_dest;
}